

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O0

void dynamic_suite::test_integer(void)

{
  string local_250 [40];
  undefined1 local_228 [8];
  variable value;
  undefined1 local_1e8 [8];
  oarchive ar;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            ((basic_oarchive<char> *)local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_228,2);
  boost::archive::detail::interface_oarchive<trial::protocol::json::basic_oarchive<char>>::
  operator<<((interface_oarchive<trial::protocol::json::basic_oarchive<char>> *)local_1e8,
             (basic_variable<std::allocator<char>_> *)local_228);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("result.str()","\"2\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x28f,"void dynamic_suite::test_integer()",local_250,"2");
  std::__cxx11::string::~string(local_250);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_228);
  trial::protocol::json::basic_oarchive<char>::~basic_oarchive((basic_oarchive<char> *)local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_integer()
{
    std::ostringstream result;
    json::oarchive ar(result);
    variable value(2);
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "2");
}